

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O3

bool __thiscall setup::anon_unknown_0::evaluator::eval_factor(evaluator *this,bool lazy)

{
  token_type tVar1;
  bool bVar2;
  int iVar3;
  runtime_error *this_00;
  byte bVar4;
  
  bVar4 = 0;
  while (tVar1 = this->token, tVar1 == op_not) {
    next(this);
    bVar4 = bVar4 ^ 1;
  }
  if (tVar1 == identifier) {
    bVar2 = true;
    if (!lazy) {
      iVar3 = std::__cxx11::string::compare
                        ((ulong)this->test,0,(char *)0xffffffffffffffff,(ulong)this->token_start);
      bVar2 = iVar3 == 0;
    }
LAB_00135724:
    next(this);
    return (bool)(bVar4 ^ bVar2);
  }
  if (tVar1 == paren_left) {
    next(this);
    bVar2 = eval_expression(this,lazy,true);
    if (this->token == paren_right) goto LAB_00135724;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"expected closing parenthesis");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unexpected token");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool eval_factor(bool lazy) {
		if(token == paren_left) {
			next();
			bool result = eval_expression(lazy);
			if(token != paren_right) {
				throw std::runtime_error("expected closing parenthesis");
			}
			next();
			return result;
		} else if(token == op_not) {
			next();
			return !eval_factor(lazy);
		} else if(token == identifier) {
			return eval_identifier(lazy);
		} else {
			throw std::runtime_error("unexpected token");
		}
	}